

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

_Bool sbs_check_type(sbs_t *sbs,uint8_t type)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  
  lVar1 = (long)(sbs->roaring->high_low_container).size;
  bVar3 = true;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      if (bVar3) {
        bVar3 = (sbs->roaring->high_low_container).typecodes[lVar2] == type;
      }
      else {
        bVar3 = false;
      }
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  return bVar3;
}

Assistant:

bool sbs_check_type(sbs_t *sbs, uint8_t type) {
    bool answer = true;
    for (int32_t i = 0; i < sbs->roaring->high_low_container.size; i++) {
        answer =
            answer && (sbs->roaring->high_low_container.typecodes[i] == type);
    }
    return answer;
}